

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  float *pfVar1;
  float *pfVar2;
  ImDrawList *pIVar3;
  ImDrawCmd *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int i;
  long lVar8;
  long lVar9;
  int cmd_i;
  long lVar10;
  float fVar11;
  float fVar12;
  
  for (lVar8 = 0; lVar8 < this->CmdListsCount; lVar8 = lVar8 + 1) {
    pIVar3 = this->CmdLists[lVar8];
    lVar9 = 0;
    for (lVar10 = 0; lVar10 < (pIVar3->CmdBuffer).Size; lVar10 = lVar10 + 1) {
      pIVar4 = (pIVar3->CmdBuffer).Data;
      pfVar1 = (float *)((long)&(pIVar4->ClipRect).x + lVar9);
      fVar5 = pfVar1[1];
      fVar6 = pfVar1[2];
      fVar7 = pfVar1[3];
      fVar11 = (*fb_scale).x;
      fVar12 = (*fb_scale).y;
      pfVar2 = (float *)((long)&(pIVar4->ClipRect).x + lVar9);
      *pfVar2 = *pfVar1 * fVar11;
      pfVar2[1] = fVar5 * fVar12;
      pfVar2[2] = fVar6 * fVar11;
      pfVar2[3] = fVar7 * fVar12;
      lVar9 = lVar9 + 0x38;
    }
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}